

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O3

void Assimp::FBX::anon_unknown_3::TokenizeError(string *message,uint line,uint column)

{
  runtime_error *this;
  string local_68;
  string local_48;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FBX-Tokenize","");
  Util::AddLineAndColumn(&local_48,&local_68,message,line,column);
  std::runtime_error::runtime_error(this,(string *)&local_48);
  *(undefined ***)this = &PTR__runtime_error_007da4b8;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void TokenizeError(const std::string& message, unsigned int line, unsigned int column)
{
    throw DeadlyImportError(Util::AddLineAndColumn("FBX-Tokenize",message,line,column));
}